

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O3

ze_result_t
driver::zeCommandListIsImmediate(ze_command_list_handle_t hCommandList,ze_bool_t *pIsImmediate)

{
  ze_result_t zVar1;
  
  if (DAT_0010e3f0 != (code *)0x0) {
    zVar1 = (*DAT_0010e3f0)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListIsImmediate(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        ze_bool_t* pIsImmediate                         ///< [out] Boolean indicating whether the command list is an immediate
                                                        ///< command list (true) or not (false)
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnIsImmediate = context.zeDdiTable.CommandList.pfnIsImmediate;
        if( nullptr != pfnIsImmediate )
        {
            result = pfnIsImmediate( hCommandList, pIsImmediate );
        }
        else
        {
            // generic implementation
        }

        return result;
    }